

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exactfloat.cc
# Opt level: O1

ExactFloat __thiscall ExactFloat::RoundToMaxPrec(ExactFloat *this,int max_prec,RoundingMode mode)

{
  int iVar1;
  BIGNUM *extraout_RDX;
  undefined4 in_register_00000034;
  ExactFloat *b;
  ExactFloat EVar3;
  S2LogMessage local_30;
  BigNum BVar2;
  
  b = (ExactFloat *)CONCAT44(in_register_00000034,max_prec);
  if ((int)mode < 2) {
    S2LogMessage::S2LogMessage
              (&local_30,
               "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/util/math/exactfloat/exactfloat.cc"
               ,0x10d,kFatal,(ostream *)&std::cerr);
    std::__ostream_insert<char,std::char_traits<char>>
              (local_30.stream_,"Check failed: (max_prec) >= (2) ",0x20);
  }
  else {
    if ((int)mode < 0x4000001) {
      iVar1 = BN_num_bits((BIGNUM *)(b->bn_).bn_);
      if (iVar1 - mode == 0 || iVar1 < (int)mode) {
        ExactFloat(this,b);
        BVar2.bn_ = extraout_RDX;
      }
      else {
        EVar3 = RoundToPowerOf2(this,max_prec,(iVar1 - mode) + b->bn_exp_);
        BVar2 = EVar3.bn_.bn_;
      }
      EVar3.bn_.bn_ = BVar2.bn_;
      EVar3._0_8_ = this;
      return EVar3;
    }
    S2LogMessage::S2LogMessage
              (&local_30,
               "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/util/math/exactfloat/exactfloat.cc"
               ,0x10e,kFatal,(ostream *)&std::cerr);
    std::__ostream_insert<char,std::char_traits<char>>
              (local_30.stream_,"Check failed: (max_prec) <= (kMaxPrec) ",0x27);
  }
  abort();
}

Assistant:

ExactFloat ExactFloat::RoundToMaxPrec(int max_prec, RoundingMode mode) const {
  // The "kRoundTiesToEven" mode requires at least 2 bits of precision
  // (otherwise both adjacent representable values may be odd).
  S2_DCHECK_GE(max_prec, 2);
  S2_DCHECK_LE(max_prec, kMaxPrec);

  // The following test also catches zero, infinity, and NaN.
  int shift = prec() - max_prec;
  if (shift <= 0) return *this;

  // Round by removing the appropriate number of bits from the mantissa.  Note
  // that if the value is rounded up to a power of 2, the high-order bit
  // position may increase, but in that case Canonicalize() will remove at
  // least one zero bit and so the output will still have prec() <= max_prec.
  return RoundToPowerOf2(bn_exp_ + shift, mode);
}